

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O2

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenNumType(Lexer *this,uint64_t num)

{
  int iVar1;
  _func_int **pp_Var2;
  undefined1 local_80 [24];
  Position local_68;
  undefined1 local_4c [28];
  
  iVar1 = *(int *)(num + 0xb0);
  if (iVar1 - 0x30U < 10) {
    local_80._22_2_ = 2;
    local_4c._0_4_ = 8;
    getCurrentCursor(&local_68,(Lexer *)num);
    local_4c._12_8_ = *(undefined8 *)(num + 0xa8);
    local_4c._4_8_ = local_68.line;
    local_4c._20_8_ = local_4c._12_8_;
    std::
    make_unique<pfederc::Error<pfederc::LexerErrorCode>,pfederc::Level,pfederc::LexerErrorCode,pfederc::Position>
              ((Level *)local_80,(LexerErrorCode *)(local_80 + 0x16),(Position *)local_4c);
    generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                        *)num);
    std::
    unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                   *)local_80);
    return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
           (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
  }
  if (iVar1 == 0x4c) {
    nextChar((Lexer *)num);
    local_80._0_2_ = LVL_HELP|LVL_WARNING;
    getCurrentCursor((Position *)(local_4c + 4),(Lexer *)num);
    std::
    make_unique<pfederc::NumberToken,pfederc::Token*&,pfederc::TokenType,pfederc::Position,unsigned_long&>
              ((Token **)&local_68,(TokenType *)(num + 0xb8),(Position *)local_80,
               (unsigned_long *)(local_4c + 4));
    pp_Var2 = (_func_int **)local_68.line;
  }
  else if (iVar1 == 0x53) {
    nextChar((Lexer *)num);
    local_80._0_2_ = LVL_NOTE|LVL_ERROR|LVL_WARNING;
    getCurrentCursor((Position *)(local_4c + 4),(Lexer *)num);
    std::
    make_unique<pfederc::NumberToken,pfederc::Token*&,pfederc::TokenType,pfederc::Position,unsigned_long&>
              ((Token **)&local_68,(TokenType *)(num + 0xb8),(Position *)local_80,
               (unsigned_long *)(local_4c + 4));
    pp_Var2 = (_func_int **)local_68.line;
  }
  else {
    if (iVar1 == 0x6c) {
      nextChar((Lexer *)num);
    }
    else {
      if (iVar1 == 0x73) {
        nextChar((Lexer *)num);
        local_80._0_2_ = LVL_NOTE|LVL_ERROR;
        getCurrentCursor((Position *)(local_4c + 4),(Lexer *)num);
        std::
        make_unique<pfederc::NumberToken,pfederc::Token*&,pfederc::TokenType,pfederc::Position,unsigned_long&>
                  ((Token **)&local_68,(TokenType *)(num + 0xb8),(Position *)local_80,
                   (unsigned_long *)(local_4c + 4));
        pp_Var2 = (_func_int **)local_68.line;
        goto LAB_00109d95;
      }
      if (iVar1 == 0x75) {
        iVar1 = nextChar((Lexer *)num);
        if (iVar1 == 0x4c) {
          nextChar((Lexer *)num);
          local_80._0_2_ = LVL_HELP|LVL_NOTE|LVL_WARNING;
          getCurrentCursor((Position *)(local_4c + 4),(Lexer *)num);
          std::
          make_unique<pfederc::NumberToken,pfederc::Token*&,pfederc::TokenType,pfederc::Position,unsigned_long&>
                    ((Token **)&local_68,(TokenType *)(num + 0xb8),(Position *)local_80,
                     (unsigned_long *)(local_4c + 4));
          pp_Var2 = (_func_int **)local_68.line;
          goto LAB_00109d95;
        }
        if (iVar1 == 0x53) {
          nextChar((Lexer *)num);
          local_80._0_2_ = LVL_HELP|LVL_ERROR|LVL_WARNING;
          getCurrentCursor((Position *)(local_4c + 4),(Lexer *)num);
          std::
          make_unique<pfederc::NumberToken,pfederc::Token*&,pfederc::TokenType,pfederc::Position,unsigned_long&>
                    ((Token **)&local_68,(TokenType *)(num + 0xb8),(Position *)local_80,
                     (unsigned_long *)(local_4c + 4));
          pp_Var2 = (_func_int **)local_68.line;
          goto LAB_00109d95;
        }
        if (iVar1 == 0x6c) {
          nextChar((Lexer *)num);
          local_80._0_2_ = LVL_HELP|LVL_NOTE;
          getCurrentCursor((Position *)(local_4c + 4),(Lexer *)num);
          std::
          make_unique<pfederc::NumberToken,pfederc::Token*&,pfederc::TokenType,pfederc::Position,unsigned_long&>
                    ((Token **)&local_68,(TokenType *)(num + 0xb8),(Position *)local_80,
                     (unsigned_long *)(local_4c + 4));
          pp_Var2 = (_func_int **)local_68.line;
          goto LAB_00109d95;
        }
        if (iVar1 == 0x73) {
          nextChar((Lexer *)num);
          local_80._0_2_ = LVL_HELP|LVL_ERROR;
          getCurrentCursor((Position *)(local_4c + 4),(Lexer *)num);
          std::
          make_unique<pfederc::NumberToken,pfederc::Token*&,pfederc::TokenType,pfederc::Position,unsigned_long&>
                    ((Token **)&local_68,(TokenType *)(num + 0xb8),(Position *)local_80,
                     (unsigned_long *)(local_4c + 4));
          pp_Var2 = (_func_int **)local_68.line;
          goto LAB_00109d95;
        }
        iVar1 = isalnum(*(int *)(num + 0xb0));
        if (iVar1 == 0) {
          local_80._0_2_ = LVL_HELP|LVL_NOTE;
          getCurrentCursor((Position *)(local_4c + 4),(Lexer *)num);
          std::
          make_unique<pfederc::NumberToken,pfederc::Token*&,pfederc::TokenType,pfederc::Position,unsigned_long&>
                    ((Token **)&local_68,(TokenType *)(num + 0xb8),(Position *)local_80,
                     (unsigned_long *)(local_4c + 4));
          pp_Var2 = (_func_int **)local_68.line;
          goto LAB_00109d95;
        }
      }
    }
    pp_Var2 = (_func_int **)0x0;
  }
LAB_00109d95:
  iVar1 = isalnum(*(int *)(num + 0xb0));
  if (iVar1 == 0) {
    if (pp_Var2 == (_func_int **)0x0) {
      local_80._0_2_ = LVL_HELP;
      getCurrentCursor((Position *)(local_4c + 4),(Lexer *)num);
      std::
      make_unique<pfederc::NumberToken,pfederc::Token*&,pfederc::TokenType,pfederc::Position,unsigned_long&>
                ((Token **)&local_68,(TokenType *)(num + 0xb8),(Position *)local_80,
                 (unsigned_long *)(local_4c + 4));
      this->_vptr_Lexer = (_func_int **)local_68.line;
    }
    else {
      this->_vptr_Lexer = pp_Var2;
    }
  }
  else {
    local_80._22_2_ = 2;
    local_4c._0_4_ = 9;
    getCurrentCursor(&local_68,(Lexer *)num);
    local_4c._12_8_ = *(undefined8 *)(num + 0xa8);
    local_4c._4_8_ = local_68.line;
    local_4c._20_8_ = local_4c._12_8_;
    std::
    make_unique<pfederc::Error<pfederc::LexerErrorCode>,pfederc::Level,pfederc::LexerErrorCode,pfederc::Position>
              ((Level *)local_80,(LexerErrorCode *)(local_80 + 0x16),(Position *)local_4c);
    generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                        *)num);
    std::
    unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                   *)local_80);
    if (pp_Var2 != (_func_int **)0x0) {
      (**(code **)(*pp_Var2 + 8))(pp_Var2);
    }
  }
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenNumType(std::uint64_t num) noexcept {
  if (isdigit(currentChar))
    return generateError(std::make_unique<LexerError>(LVL_ERROR,
      LexerErrorCode::LEX_ERR_NUM_UNEXPECTED_CHAR_DIGIT, Position{getCurrentCursor().line,
        currentEndIndex, currentEndIndex}));

  std::unique_ptr<Token> tok(nullptr);
  switch (currentChar) {
  case 'u':
    switch (nextChar()) {
      case 's':
        nextChar();
        tok = std::make_unique<NumberToken>(currentToken, TokenType::TOK_UINT8,
          getCurrentCursor(), num);
        break;
      case 'S':
        nextChar();
        tok = std::make_unique<NumberToken>(currentToken, TokenType::TOK_UINT16,
          getCurrentCursor(), num);
        break;
      case 'l':
        nextChar();
        tok = std::make_unique<NumberToken>(currentToken, TokenType::TOK_UINT32,
          getCurrentCursor(), num);
        break;
      case 'L':
        nextChar();
        tok = std::make_unique<NumberToken>(currentToken, TokenType::TOK_UINT64,
          getCurrentCursor(), num);
        break;
      default:
        if (!isalnum(currentChar))
          tok = std::make_unique<NumberToken>(currentToken, TokenType::TOK_UINT32,
            getCurrentCursor(), num);
        break;
    }
    break;
  case 's':
    nextChar();
    tok = std::make_unique<NumberToken>(currentToken, TokenType::TOK_INT8,
      getCurrentCursor(), num);
    break;
  case 'S':
    nextChar();
    tok = std::make_unique<NumberToken>(currentToken, TokenType::TOK_INT16,
      getCurrentCursor(), num);
    break;
  case 'l':
    nextChar();
    break;
  case 'L':
    nextChar();
    tok = std::make_unique<NumberToken>(currentToken, TokenType::TOK_INT64,
      getCurrentCursor(), num);
    break;
  default:
    break;
  }

  if (isalnum(currentChar))
    return generateError(std::make_unique<LexerError>(LVL_ERROR,
      LexerErrorCode::LEX_ERR_NUM_UNEXPECTED_CHAR, Position{getCurrentCursor().line,
        currentEndIndex, currentEndIndex}));

  if (!tok)
    return std::make_unique<NumberToken>(currentToken, TokenType::TOK_INT32,
      getCurrentCursor(), num);

  return tok;
}